

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O0

void ZXing::GetPatternRow<ZXing::StrideIter<unsigned_char_const*>>
               (Range<ZXing::StrideIter<const_unsigned_char_*>_> b_row,PatternRow *p_row)

{
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  __first;
  uchar uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  StrideIter<const_unsigned_char_*> *this;
  size_type in_RDI;
  StrideIter<const_unsigned_char_*> SVar5;
  unsigned_short *intPos;
  StrideIter<const_unsigned_char_*> bitPosEnd;
  StrideIter<const_unsigned_char_*> bitPos;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Range<ZXing::StrideIter<const_unsigned_char_*>_> *this_00;
  unsigned_short *local_48;
  StrideIter<const_unsigned_char_*> local_40;
  StrideIter<const_unsigned_char_*> local_30;
  undefined4 local_1c;
  unsigned_short *local_18;
  unsigned_short *local_10;
  
  this_00 = (Range<ZXing::StrideIter<const_unsigned_char_*>_> *)&stack0x00000008;
  Range<ZXing::StrideIter<const_unsigned_char_*>_>::size(this_00);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,in_RDI);
  local_10 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (in_stack_ffffffffffffff88);
  local_18 = (unsigned_short *)
             std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                       (in_stack_ffffffffffffff88);
  local_1c = 0;
  __first._M_current._4_4_ = in_stack_ffffffffffffffa4;
  __first._M_current._0_4_ = in_stack_ffffffffffffffa0;
  std::
  fill<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>,int>
            (__first,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SVar5 = Range<ZXing::StrideIter<const_unsigned_char_*>_>::begin(this_00);
  local_30.pos = SVar5.pos;
  local_30.stride = SVar5.stride;
  SVar5 = Range<ZXing::StrideIter<const_unsigned_char_*>_>::end(this_00);
  local_40.pos = SVar5.pos;
  local_40.stride = SVar5.stride;
  local_48 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
                       ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x21c392);
  uVar1 = StrideIter<const_unsigned_char_*>::operator*(&local_30);
  if (uVar1 != '\0') {
    local_48 = local_48 + 1;
  }
  while( true ) {
    this = StrideIter<const_unsigned_char_*>::operator++(&local_30);
    bVar2 = StrideIter<const_unsigned_char_*>::operator!=(this,&local_40);
    if (!bVar2) break;
    *local_48 = *local_48 + 1;
    bVar3 = StrideIter<const_unsigned_char_*>::operator[](&local_30,0);
    uVar4 = (uint)bVar3;
    bVar3 = StrideIter<const_unsigned_char_*>::operator[](&local_30,-1);
    local_48 = local_48 + (int)(uint)(uVar4 != bVar3);
  }
  *local_48 = *local_48 + 1;
  StrideIter<const_unsigned_char_*>::operator[](&local_30,-1);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::data
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x21c479);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)this_00,in_RDI);
  return;
}

Assistant:

void GetPatternRow(Range<I> b_row, PatternRow& p_row)
{
	// TODO: if reactivating the bit-packed array (!ZX_FAST_BIT_STORAGE) should be of interest then the following code could be
	// considerably speed up by using a specialized variant along the lines of the old BitArray::getNextSetTo() function that
	// was removed between 1.4 and 2.0.

#if 0
	p_row.reserve(64);
	p_row.clear();

	auto lastPos = b_row.begin();
	if (*lastPos)
		p_row.push_back(0); // first value is number of white pixels, here 0

	for (auto p = b_row.begin() + 1; p < b_row.end(); ++p)
		if (bool(*p) != bool(*lastPos))
			p_row.push_back(p - std::exchange(lastPos, p));

	p_row.push_back(b_row.end() - lastPos);

	if (*lastPos)
		p_row.push_back(0); // last value is number of white pixels, here 0
#else
	p_row.resize(b_row.size() + 2);
	std::fill(p_row.begin(), p_row.end(), 0);

	auto bitPos = b_row.begin();
	const auto bitPosEnd = b_row.end();
	auto intPos = p_row.data();

	if (*bitPos)
		intPos++; // first value is number of white pixels, here 0

	// The following code as been observed to cause a speedup of up to 30% on large images on an AVX cpu
	// and on an a Google Pixel 3 Android phone. Your mileage may vary.
	if constexpr (std::is_pointer_v<I> && sizeof(I) == 8 && sizeof(std::remove_pointer_t<I>) == 1) {
		using simd_t = uint64_t;
		while (bitPos < bitPosEnd - sizeof(simd_t)) {
			auto asSimd0 = BitHacks::LoadU<simd_t>(bitPos);
			auto asSimd1 = BitHacks::LoadU<simd_t>(bitPos + 1);
			auto z = asSimd0 ^ asSimd1;
			if (z) {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
				int step = BitHacks::NumberOfTrailingZeros(z) / 8 + 1;
#else
				int step = BitHacks::NumberOfLeadingZeros(z) / 8 + 1;
#endif
				(*intPos++) += step;
				bitPos += step;
			} else {
				(*intPos) += sizeof(simd_t);
				bitPos += sizeof(simd_t);
			}
		}
	}

	while (++bitPos != bitPosEnd) {
		++(*intPos);
		intPos += bitPos[0] != bitPos[-1];
	}
	++(*intPos);

	if (bitPos[-1])
		intPos++;

	p_row.resize(intPos - p_row.data() + 1);
#endif
}